

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::TestGroupStats::~TestGroupStats(TestGroupStats *this)

{
  void *in_RDI;
  
  ~TestGroupStats((TestGroupStats *)0x27dc08);
  operator_delete(in_RDI,0x78);
  return;
}

Assistant:

TestGroupStats::~TestGroupStats() = default;